

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O0

void CTcMain::S_v_log_error
               (CTcTokFileDesc *linedesc,long linenum,int *err_counter,int *warn_counter,
               int *first_error,int *first_warning,unsigned_long options,int *suppress_list,
               size_t suppress_cnt,tc_severity_t severity,int err,__va_list_tag *args)

{
  char *pcVar1;
  undefined8 in_stack_00000008;
  unsigned_long in_stack_00000010;
  undefined4 in_stack_00000028;
  char msgbuf [2048];
  char *msg;
  int *in_stack_000017d0;
  int *in_stack_000017d8;
  int *in_stack_000017e0;
  int *in_stack_000017e8;
  long in_stack_000017f0;
  CTcTokFileDesc *in_stack_000017f8;
  unsigned_long in_stack_00001810;
  int *in_stack_00001818;
  size_t in_stack_00001820;
  tc_severity_t in_stack_00001828;
  int in_stack_00001830;
  undefined4 in_stack_fffffffffffff7ac;
  char *in_stack_fffffffffffff7b0;
  __va_list_tag *in_stack_fffffffffffff9b8;
  char *in_stack_fffffffffffff9c0;
  size_t in_stack_fffffffffffff9c8;
  char *in_stack_fffffffffffff9d0;
  
  pcVar1 = log_msg_internal_1(in_stack_000017f8,in_stack_000017f0,in_stack_000017e8,
                              in_stack_000017e0,in_stack_000017d8,in_stack_000017d0,
                              in_stack_00001810,in_stack_00001818,in_stack_00001820,
                              in_stack_00001828,in_stack_00001830);
  if (pcVar1 != (char *)0x0) {
    t3vsprintf(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
               in_stack_fffffffffffff9b8);
    format_message(in_stack_fffffffffffff7b0,CONCAT44(in_stack_fffffffffffff7ac,in_stack_00000028));
    log_msg_internal_2(in_stack_00000010,in_stack_00000008._4_4_);
  }
  return;
}

Assistant:

void CTcMain::S_v_log_error(CTcTokFileDesc *linedesc, long linenum,
                            int *err_counter, int *warn_counter,
                            int *first_error, int *first_warning,
                            unsigned long options,
                            const int *suppress_list, size_t suppress_cnt,
                            tc_severity_t severity, int err, va_list args)
{
    const char *msg;
    char msgbuf[2048];

    /* show the prefix */
    msg = log_msg_internal_1(linedesc, linenum, err_counter, warn_counter,
                             first_error, first_warning, options,
                             suppress_list, suppress_cnt, severity, err);

    /* if the message is suppressed, we're done */
    if (msg == 0)
        return;

    /* format the message using the va_list argument */
    t3vsprintf(msgbuf, sizeof(msgbuf), msg, args);

    /* display it */
    format_message(msgbuf, options);

    /* show the suffix */
    log_msg_internal_2(options, severity);
}